

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::render_pass2_is_supported(Impl *this,VkRenderPassCreateInfo2 *info)

{
  size_type sVar1;
  VkSubpassDescriptionDepthStencilResolve *pVVar2;
  VkFragmentShadingRateAttachmentInfoKHR *pVVar3;
  bool bVar4;
  uint local_a4;
  uint local_a0;
  uint32_t i_3;
  uint32_t i_2;
  uint32_t i_1;
  VkFragmentShadingRateAttachmentInfoKHR *rate_attachment;
  VkSubpassDescriptionDepthStencilResolve *ds_resolve;
  uint32_t k_1;
  uint32_t k;
  uint32_t j;
  VkFormatFeatureFlags format_features;
  uint32_t i;
  byte local_4b;
  byte local_4a;
  allocator local_49;
  string local_48 [36];
  undefined4 local_24;
  VkRenderPassCreateInfo2 *pVStack_20;
  VkRenderPassCreateFlags supported_flags;
  VkRenderPassCreateInfo2 *info_local;
  Impl *this_local;
  
  local_24 = 2;
  if ((info->flags & 0xfffffffd) == 0) {
    local_4a = 0;
    local_4b = 0;
    bVar4 = false;
    pVStack_20 = info;
    info_local = (VkRenderPassCreateInfo2 *)this;
    if ((info->flags & 2) != 0) {
      std::allocator<char>::allocator();
      local_4a = 1;
      std::__cxx11::string::string(local_48,"VK_QCOM_render_pass_transform",&local_49);
      local_4b = 1;
      sVar1 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_48);
      bVar4 = sVar1 == 0;
    }
    if ((local_4b & 1) != 0) {
      std::__cxx11::string::~string(local_48);
    }
    if ((local_4a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_49);
    }
    if (bVar4) {
      this_local._7_1_ = false;
    }
    else if ((this->null_device & 1U) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&i,"VK_KHR_create_renderpass2",(allocator *)((long)&format_features + 3))
      ;
      sVar1 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)&i);
      bVar4 = false;
      if (sVar1 == 0) {
        bVar4 = this->api_version < 0x402000;
      }
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)((long)&format_features + 3));
      if (bVar4) {
        this_local._7_1_ = false;
      }
      else {
        bVar4 = pnext_chain_is_supported(this,pVStack_20->pNext);
        if (bVar4) {
          for (j = 0; j < pVStack_20->attachmentCount; j = j + 1) {
            k = 0;
            for (k_1 = 0; k_1 < pVStack_20->subpassCount; k_1 = k_1 + 1) {
              for (ds_resolve._4_4_ = 0;
                  ds_resolve._4_4_ < pVStack_20->pSubpasses[k_1].colorAttachmentCount;
                  ds_resolve._4_4_ = ds_resolve._4_4_ + 1) {
                if (pVStack_20->pSubpasses[k_1].pColorAttachments[ds_resolve._4_4_].attachment == j)
                {
                  k = k | 0x80;
                }
                if ((pVStack_20->pSubpasses[k_1].pResolveAttachments !=
                     (VkAttachmentReference2 *)0x0) &&
                   (pVStack_20->pSubpasses[k_1].pResolveAttachments[ds_resolve._4_4_].attachment ==
                    j)) {
                  k = k | 0x80;
                }
              }
              for (ds_resolve._0_4_ = 0;
                  (uint)ds_resolve < pVStack_20->pSubpasses[k_1].inputAttachmentCount;
                  ds_resolve._0_4_ = (uint)ds_resolve + 1) {
                if (pVStack_20->pSubpasses[k_1].pInputAttachments[(uint)ds_resolve].attachment == j)
                {
                  k = k | 1;
                }
              }
              if ((pVStack_20->pSubpasses[k_1].pDepthStencilAttachment !=
                   (VkAttachmentReference2 *)0x0) &&
                 ((pVStack_20->pSubpasses[k_1].pDepthStencilAttachment)->attachment == j)) {
                k = k | 0x200;
              }
              pVVar2 = find_pnext<VkSubpassDescriptionDepthStencilResolve>
                                 (VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE,
                                  pVStack_20->pSubpasses[k_1].pNext);
              if (((pVVar2 != (VkSubpassDescriptionDepthStencilResolve *)0x0) &&
                  (pVVar2->pDepthStencilResolveAttachment != (VkAttachmentReference2 *)0x0)) &&
                 (pVVar2->pDepthStencilResolveAttachment->attachment == j)) {
                k = k | 0x200;
              }
              pVVar3 = find_pnext<VkFragmentShadingRateAttachmentInfoKHR>
                                 (VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR,
                                  pVStack_20->pSubpasses[k_1].pNext);
              if (((pVVar3 != (VkFragmentShadingRateAttachmentInfoKHR *)0x0) &&
                  (pVVar3->pFragmentShadingRateAttachment != (VkAttachmentReference2 *)0x0)) &&
                 (pVVar3->pFragmentShadingRateAttachment->attachment == j)) {
                k = k | 0x40000000;
              }
            }
            bVar4 = attachment_description2_is_supported(this,pVStack_20->pAttachments + j,k);
            if (!bVar4) {
              return false;
            }
          }
          for (i_3 = 0; i_3 < pVStack_20->subpassCount; i_3 = i_3 + 1) {
            bVar4 = subpass_description2_is_supported(this,pVStack_20->pSubpasses + i_3);
            if (!bVar4) {
              return false;
            }
          }
          for (local_a0 = 0; local_a0 < pVStack_20->dependencyCount; local_a0 = local_a0 + 1) {
            bVar4 = subpass_dependency2_is_supported(this,pVStack_20->pDependencies + local_a0);
            if (!bVar4) {
              return false;
            }
          }
          for (local_a4 = 0; local_a4 < pVStack_20->correlatedViewMaskCount; local_a4 = local_a4 + 1
              ) {
            bVar4 = multiview_mask_is_supported(this,pVStack_20->pCorrelatedViewMasks[local_a4]);
            if (!bVar4) {
              return false;
            }
          }
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::render_pass2_is_supported(const VkRenderPassCreateInfo2 *info) const
{
	// Only allow flags we recognize and validate.
	constexpr VkRenderPassCreateFlags supported_flags = VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM;
	if ((info->flags & ~supported_flags) != 0)
		return false;

	if ((info->flags & VK_RENDER_PASS_CREATE_TRANSFORM_BIT_QCOM) != 0 &&
	    enabled_extensions.count(VK_QCOM_RENDER_PASS_TRANSFORM_EXTENSION_NAME) == 0)
		return false;

	if (null_device)
		return true;

	if (!enabled_extensions.count(VK_KHR_CREATE_RENDERPASS_2_EXTENSION_NAME) && api_version < VK_API_VERSION_1_2)
		return false;

	if (!pnext_chain_is_supported(info->pNext))
		return false;

	for (uint32_t i = 0; i < info->attachmentCount; i++)
	{
		VkFormatFeatureFlags format_features = 0;

		for (uint32_t j = 0; j < info->subpassCount; j++)
		{
			for (uint32_t k = 0; k < info->pSubpasses[j].colorAttachmentCount; k++)
			{
				if (info->pSubpasses[j].pColorAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;

				if (info->pSubpasses[j].pResolveAttachments &&
				    info->pSubpasses[j].pResolveAttachments[k].attachment == i)
				{
					format_features |= VK_FORMAT_FEATURE_COLOR_ATTACHMENT_BIT;
				}
			}

			for (uint32_t k = 0; k < info->pSubpasses[j].inputAttachmentCount; k++)
				if (info->pSubpasses[j].pInputAttachments[k].attachment == i)
					format_features |= VK_FORMAT_FEATURE_SAMPLED_IMAGE_BIT;

			if (info->pSubpasses[j].pDepthStencilAttachment &&
			    info->pSubpasses[j].pDepthStencilAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT;
			}

			auto *ds_resolve = find_pnext<VkSubpassDescriptionDepthStencilResolve>(
					VK_STRUCTURE_TYPE_SUBPASS_DESCRIPTION_DEPTH_STENCIL_RESOLVE, info->pSubpasses[j].pNext);
			if (ds_resolve &&
			    ds_resolve->pDepthStencilResolveAttachment &&
			    ds_resolve->pDepthStencilResolveAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_DEPTH_STENCIL_ATTACHMENT_BIT;
			}

			auto *rate_attachment = find_pnext<VkFragmentShadingRateAttachmentInfoKHR>(
					VK_STRUCTURE_TYPE_FRAGMENT_SHADING_RATE_ATTACHMENT_INFO_KHR, info->pSubpasses[j].pNext);
			if (rate_attachment &&
			    rate_attachment->pFragmentShadingRateAttachment &&
			    rate_attachment->pFragmentShadingRateAttachment->attachment == i)
			{
				format_features |= VK_FORMAT_FEATURE_FRAGMENT_SHADING_RATE_ATTACHMENT_BIT_KHR;
			}
		}

		if (!attachment_description2_is_supported(info->pAttachments[i], format_features))
			return false;
	}

	for (uint32_t i = 0; i < info->subpassCount; i++)
	{
		if (!subpass_description2_is_supported(info->pSubpasses[i]))
			return false;
	}

	for (uint32_t i = 0; i < info->dependencyCount; i++)
	{
		if (!subpass_dependency2_is_supported(info->pDependencies[i]))
			return false;
	}

	for (uint32_t i = 0; i < info->correlatedViewMaskCount; i++)
		if (!multiview_mask_is_supported(info->pCorrelatedViewMasks[i]))
			return false;

	return true;
}